

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O0

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::put<pstore::address>
          (database_writer_policy *this,address *value)

{
  element_type *peVar1;
  address aVar2;
  shared_ptr<pstore::address> local_70 [2];
  pair<std::shared_ptr<pstore::address>,_pstore::typed_address<pstore::address>_> local_50;
  typed_address<pstore::address> local_38;
  typed_address<pstore::address> addr;
  shared_ptr<pstore::address> ptr;
  address *value_local;
  database_writer_policy *this_local;
  
  std::shared_ptr<pstore::address>::shared_ptr((shared_ptr<pstore::address> *)&addr);
  local_38 = typed_address<pstore::address>::null();
  transaction_base::alloc_rw<pstore::address,void>(&local_50,this->transaction_,1);
  std::tie<std::shared_ptr<pstore::address>,pstore::typed_address<pstore::address>>(local_70,&addr);
  std::tuple<std::shared_ptr<pstore::address>&,pstore::typed_address<pstore::address>&>::operator=
            ((tuple<std::shared_ptr<pstore::address>&,pstore::typed_address<pstore::address>&> *)
             local_70,&local_50);
  std::pair<std::shared_ptr<pstore::address>,_pstore::typed_address<pstore::address>_>::~pair
            (&local_50);
  peVar1 = std::__shared_ptr_access<pstore::address,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<pstore::address,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&addr);
  peVar1->a_ = value->a_;
  aVar2 = typed_address<pstore::address>::to_address(&local_38);
  std::shared_ptr<pstore::address>::~shared_ptr((shared_ptr<pstore::address> *)&addr);
  return (result_type)aVar2.a_;
}

Assistant:

auto put (Ty const & value) -> result_type {
                        std::shared_ptr<Ty> ptr;
                        auto addr = typed_address<Ty>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<Ty> ();
                        *ptr = value;
                        return addr.to_address ();
                    }